

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLocalDecl
          (BinaryReaderInterp *this,Index decl_index,Index count,Type type)

{
  bool bVar1;
  value_type local_68;
  Type local_58;
  Location local_50;
  Enum local_2c;
  Index local_28;
  Index local_24;
  Index count_local;
  Index decl_index_local;
  BinaryReaderInterp *this_local;
  Index IStack_10;
  Type type_local;
  
  local_28 = count;
  local_24 = decl_index;
  _count_local = this;
  unique0x100000e6 = type;
  GetLocation(&local_50,this);
  local_58 = stack0xffffffffffffffec;
  local_2c = (Enum)SharedValidator::OnLocalDecl
                             (&this->validator_,&local_50,local_28,stack0xffffffffffffffec);
  bVar1 = Failed((Result)local_2c);
  if (bVar1) {
    Result::Result((Result *)&type_local,Error);
  }
  else {
    this->local_count_ = local_28 + this->local_count_;
    local_68.type.enum_ = this_local._4_4_;
    local_68.type.type_index_ = IStack_10;
    local_68.count = local_28;
    local_68.end = this->local_count_;
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::push_back
              (&this->func_->locals,&local_68);
    Result::Result((Result *)&type_local,Ok);
  }
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderInterp::OnLocalDecl(Index decl_index,
                                       Index count,
                                       Type type) {
  CHECK_RESULT(validator_.OnLocalDecl(GetLocation(), count, type));

  local_count_ += count;
  func_->locals.push_back(LocalDesc{type, count, local_count_});
  return Result::Ok;
}